

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

osfildef * osfdup(osfildef *orig,char *mode)

{
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  char *in_RSI;
  FILE *in_RDI;
  char *m;
  char *p;
  char realmode [5];
  char *local_30;
  undefined1 *local_28;
  undefined1 local_1c;
  undefined1 local_1b [3];
  char *local_18;
  FILE *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  for (local_30 = in_RSI; *local_30 != '\0'; local_30 = local_30 + 1) {
    pcVar2 = strchr("rw+bst",(int)*local_30);
    if (pcVar2 == (char *)0x0) {
      return (osfildef *)0x0;
    }
  }
  if (((*local_18 == 'r') || (*local_18 == 'w')) && (local_18[1] == '+')) {
    local_28 = local_1b;
    local_1c = 0x2b;
  }
  else {
    if ((*local_18 != 'r') && (*local_18 != 'w')) {
      return (osfildef *)0x0;
    }
    local_28 = &local_1c;
  }
  *local_28 = 0;
  iVar1 = fileno(local_10);
  iVar1 = dup(iVar1);
  pFVar3 = fdopen(iVar1,local_18);
  return (osfildef *)pFVar3;
}

Assistant:

osfildef*
osfdup(osfildef *orig, const char *mode)
{
    char realmode[5];
    char *p = realmode;
    const char *m;

    /* verify that there aren't any unrecognized mode flags */
    for (m = mode ; *m != '\0' ; ++m)
    {
        if (strchr("rw+bst", *m) == 0)
            return 0;
    }

    /* figure the read/write mode - translate r+ and w+ to r+ */
    if ((mode[0] == 'r' || mode[0] == 'w') && mode[1] == '+')
        *p++ = 'r', *p++ = '+';
    else if (mode[0] == 'r')
        *p++ = 'r';
    else if (mode[0] == 'w')
        *p++ = 'w';
    else
        return 0;

    /* end the mode string */
    *p = '\0';

    /* duplicate the handle in the given mode */
    return fdopen(dup(fileno(orig)), mode);
}